

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

QFontEngine * __thiscall QFontEngineMulti::loadEngine(QFontEngineMulti *this,int at)

{
  long lVar1;
  ulong uVar2;
  QFontEngine *pQVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 *puVar7;
  QFontDef *pQVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<QString> local_a8;
  QFontDef request;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = &DAT_005f7388;
  pQVar8 = &request;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pQVar8->families).d.d = (Data *)*puVar7;
    puVar7 = puVar7 + 1;
    pQVar8 = (QFontDef *)&(pQVar8->families).d.ptr;
  }
  QFontDef::QFontDef(&request,&(this->super_QFontEngine).fontDef);
  request._97_1_ = request._97_1_ | 0x80;
  fallbackFamilyAt((QString *)&local_c0,this,at + -1);
  QList<QString>::QList<QString,void>((QList<QString> *)&local_a8,(QString *)&local_c0);
  QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)&request,&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  pQVar3 = QFontDatabasePrivate::findFont(&request,2,false);
  if (pQVar3 != (QFontEngine *)0x0) {
    uVar2 = *(ulong *)&(pQVar3->fontDef).field_0x60;
    uVar6 = (ulong)(uint6)request._98_6_ << 0x10 & 0x3ff0000000000;
    *(ulong *)&(pQVar3->fontDef).field_0x60 = uVar2 & 0xfffc00ffffffffff | uVar6;
    uVar4 = (ulong)(uint6)request._98_6_ << 0x10 & 0x30000000;
    if (uVar4 != 0) {
      *(ulong *)&(pQVar3->fontDef).field_0x60 = uVar2 & 0xfffc00ffcfffffff | uVar6 | uVar4;
    }
  }
  QFontDef::~QFontDef(&request);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngine *QFontEngineMulti::loadEngine(int at)
{
    QFontDef request(fontDef);
    request.styleStrategy |= QFont::NoFontMerging;
    request.families = QStringList(fallbackFamilyAt(at - 1));

    // At this point, the main script of the text has already been considered
    // when fetching the list of fallback families from the database, and the
    // info about the actual script of the characters may have been discarded,
    // so we do not check for writing system support, but instead just load
    // the family indiscriminately.
    if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, QFontDatabasePrivate::Script_Common)) {
        engine->fontDef.weight = request.weight;
        if (request.style > QFont::StyleNormal)
            engine->fontDef.style = request.style;
        return engine;
    }

    return nullptr;
}